

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

FixedTypedVector * __thiscall
flexbuffers::Reference::AsFixedTypedVector(FixedTypedVector *__return_storage_ptr__,Reference *this)

{
  byte bVar1;
  ulong *puVar2;
  char cVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  ulong uVar8;
  
  uVar4 = this->type_ - FBT_VECTOR_INT2;
  if (uVar4 < 9) {
    cVar3 = (char)((uVar4 & 0xff) / 3);
    puVar2 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar2;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar2;
    }
    else {
      uVar8 = *puVar2;
    }
    uVar7 = cVar3 + '\x02';
    uVar4 = (uint)(byte)((char)uVar4 + cVar3 * -3 + 1);
    puVar5 = (uint8_t *)((long)puVar2 - uVar8);
    uVar6 = this->byte_width_;
  }
  else {
    uVar4 = 1;
    uVar6 = '\x01';
    puVar5 = "";
    uVar7 = '\0';
  }
  (__return_storage_ptr__->super_Object).data_ = puVar5;
  (__return_storage_ptr__->super_Object).byte_width_ = uVar6;
  *(uint *)&(__return_storage_ptr__->super_Object).field_0xc = uVar4;
  __return_storage_ptr__->len_ = uVar7;
  return __return_storage_ptr__;
}

Assistant:

FixedTypedVector AsFixedTypedVector() const {
    if (IsFixedTypedVector()) {
      uint8_t len = 0;
      auto vtype = ToFixedTypedVectorElementType(type_, &len);
      return FixedTypedVector(Indirect(), byte_width_, vtype, len);
    } else {
      return FixedTypedVector::EmptyFixedTypedVector();
    }
  }